

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

void If_CluHashPrintStats(If_Man_t *p,int t)

{
  uint local_28;
  uint local_24;
  int Counter;
  int i;
  If_Hte_t *pEntry;
  int t_local;
  If_Man_t *p_local;
  
  for (local_24 = 0; (int)local_24 < p->nTableSize[t]; local_24 = local_24 + 1) {
    local_28 = 0;
    for (_Counter = (undefined8 *)p->pHashTable[t][(int)local_24]; _Counter != (undefined8 *)0x0;
        _Counter = (undefined8 *)*_Counter) {
      local_28 = local_28 + 1;
    }
    if ((local_28 != 0) && (9 < (int)local_28)) {
      printf("%d=%d ",(ulong)local_24,(ulong)local_28);
    }
  }
  return;
}

Assistant:

void If_CluHashPrintStats( If_Man_t * p, int t )
{
    If_Hte_t * pEntry;
    int i, Counter;
    for ( i = 0; i < p->nTableSize[t]; i++ )
    {
        Counter = 0;
        for ( pEntry = ((If_Hte_t **)p->pHashTable[t])[i]; pEntry; pEntry = pEntry->pNext )
            Counter++;
        if ( Counter == 0 )
            continue;
        if ( Counter < 10 )
            continue;
        printf( "%d=%d ", i, Counter );
    }
}